

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O1

void __thiscall SAT::printLearntStats(SAT *this)

{
  uint uVar1;
  Clause **ppCVar2;
  Clause *pCVar3;
  long lVar4;
  ostream *poVar5;
  ulong uVar6;
  string local_50;
  
  uVar1 = (this->learnts).sz;
  uVar6 = (ulong)uVar1;
  if (uVar6 != 0) {
    ppCVar2 = (this->learnts).data;
    lVar4 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar1 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::__introsort_loop<Clause**,long,__gnu_cxx::__ops::_Iter_comp_iter<raw_activity_gt>>
              (ppCVar2,ppCVar2 + uVar6,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<Clause**,__gnu_cxx::__ops::_Iter_comp_iter<raw_activity_gt>>
              (ppCVar2,ppCVar2 + uVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"top ten clauses:\n",0x11);
  if ((this->learnts).sz != 0) {
    uVar6 = 0;
    do {
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
      pCVar3 = (this->learnts).data[uVar6];
      poVar5 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar5,pCVar3[1].data[(ulong)(*(uint *)pCVar3 >> 8) - 1].x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      showClause_abi_cxx11_(&local_50,(this->learnts).data[uVar6]);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    } while ((uVar6 < 9) && (uVar6 = uVar6 + 1, uVar6 < (this->learnts).sz));
  }
  return;
}

Assistant:

void SAT::printLearntStats() {
	/* std::ofstream clausefile("clause-info.csv"); */
	/* for (int i = 0 ; i < learnts.size() ; i++) { */
	/*   clausefile << learnts[i]->clauseID() << "," << learnts[i]->rawActivity() << "," <<
	 * showClause(*learnts[i]) << "\n"; */
	/* } */

	std::sort((Clause**)learnts, (Clause**)learnts + learnts.size(), raw_activity_gt());
	std::cerr << "top ten clauses:\n";
	for (unsigned int i = 0; i < 10 && i < learnts.size(); i++) {
		std::cerr << i << ": " << learnts[i]->rawActivity() << " " << showClause(*learnts[i]) << "\n";
	}
}